

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

vec2f __thiscall Triangle::uv(Triangle *this,point *p)

{
  vec3f *b;
  float fVar1;
  vec2f vVar2;
  vec2f vVar3;
  vec2f vVar4;
  float fVar5;
  float fVar6;
  float fVar8;
  vec2f vVar7;
  float fVar9;
  vec3f vVar10;
  vec3f local_70;
  vec3f local_60;
  vec3f local_50;
  vec3f local_40;
  
  b = &this->v1;
  vVar2 = this->vt1;
  vVar3 = this->vt3;
  local_40 = operator-(p,b);
  local_50 = operator-(&this->v2,b);
  vVar10 = cross(&local_40,&local_50);
  fVar5 = SQRT(vVar10.z * vVar10.z + vVar10.x * vVar10.x + vVar10.y * vVar10.y);
  fVar1 = this->one_by_2S;
  vVar4 = this->vt2;
  fVar6 = (this->vt1).x;
  fVar8 = (this->vt1).y;
  local_60 = operator-(p,b);
  local_70 = operator-(&this->v3,b);
  vVar10 = cross(&local_60,&local_70);
  fVar9 = SQRT(vVar10.z * vVar10.z + vVar10.x * vVar10.x + vVar10.y * vVar10.y);
  vVar7.x = this->one_by_2S * fVar9 * (vVar4.x - fVar6) +
            fVar1 * fVar5 * (vVar3.x - vVar2.x) + fVar6;
  vVar7.y = this->one_by_2S * fVar9 * (vVar4.y - fVar8) +
            fVar1 * fVar5 * (vVar3.y - vVar2.y) + fVar8;
  return vVar7;
}

Assistant:

vec2f uv(const point& p) const
	{
		assert(onsurface(p));
		return
			vt1 + (vt3-vt1) * norm(cross(p-v1, v2-v1)) * one_by_2S
				+ (vt2-vt1) * norm(cross(p-v1, v3-v1)) * one_by_2S; // TO OPTIMIZE
	}